

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Segment::Segment(Segment *this)

{
  time_t tVar1;
  undefined4 *in_RDI;
  time_t curr_time;
  
  Cues::Cues((Cues *)(in_RDI + 2));
  SeekHead::SeekHead((SeekHead *)(in_RDI + 8));
  SegmentInfo::SegmentInfo((SegmentInfo *)(in_RDI + 0x1a));
  Tracks::Tracks((Tracks *)(in_RDI + 0x26));
  Chapters::Chapters((Chapters *)(in_RDI + 0x2a));
  Tags::Tags((Tags *)(in_RDI + 0x2e));
  in_RDI[0x32] = 0;
  *(undefined8 *)(in_RDI + 0x34) = 0;
  *(undefined8 *)(in_RDI + 0x36) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x3a) = 0;
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x3e) = 0;
  *(undefined8 *)(in_RDI + 0x42) = 0;
  in_RDI[0x44] = 0;
  in_RDI[0x45] = 0;
  in_RDI[0x46] = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined1 *)(in_RDI + 0x4a) = 0;
  *(undefined8 *)(in_RDI + 0x4c) = 0;
  in_RDI[0x4e] = 0;
  in_RDI[0x4f] = 0;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  *(undefined1 *)((long)in_RDI + 0x141) = 0;
  *(undefined8 *)(in_RDI + 0x52) = 0;
  *(undefined8 *)(in_RDI + 0x54) = 0;
  *(undefined8 *)(in_RDI + 0x24e) = 30000000000;
  *(undefined8 *)(in_RDI + 0x250) = 0;
  in_RDI[0x252] = 2;
  *(undefined1 *)(in_RDI + 0x253) = 0;
  *(undefined1 *)((long)in_RDI + 0x94d) = 1;
  *(undefined1 *)((long)in_RDI + 0x94e) = 0;
  *(undefined1 *)((long)in_RDI + 0x94f) = 0;
  *(undefined1 *)(in_RDI + 0x254) = 0;
  in_RDI[0x255] = 0;
  *(undefined8 *)(in_RDI + 0x256) = 0;
  *(undefined8 *)(in_RDI + 600) = 0;
  in_RDI[0x25a] = 4;
  in_RDI[0x25b] = 0;
  *(undefined8 *)(in_RDI + 0x25c) = 0;
  *(undefined8 *)(in_RDI + 0x25e) = 0;
  *(undefined8 *)(in_RDI + 0x260) = 0;
  *(undefined8 *)(in_RDI + 0x262) = 0;
  tVar1 = time((time_t *)0x0);
  *in_RDI = (int)tVar1;
  return;
}

Assistant:

Segment::Segment()
    : chunk_count_(0),
      chunk_name_(NULL),
      chunk_writer_cluster_(NULL),
      chunk_writer_cues_(NULL),
      chunk_writer_header_(NULL),
      chunking_(false),
      chunking_base_name_(NULL),
      cluster_list_(NULL),
      cluster_list_capacity_(0),
      cluster_list_size_(0),
      cues_position_(kAfterClusters),
      cues_track_(0),
      force_new_cluster_(false),
      frames_(NULL),
      frames_capacity_(0),
      frames_size_(0),
      has_video_(false),
      header_written_(false),
      last_block_duration_(0),
      last_timestamp_(0),
      max_cluster_duration_(kDefaultMaxClusterDuration),
      max_cluster_size_(0),
      mode_(kFile),
      new_cuepoint_(false),
      output_cues_(true),
      accurate_cluster_duration_(false),
      fixed_size_cluster_timecode_(false),
      estimate_file_duration_(false),
      ebml_header_size_(0),
      payload_pos_(0),
      size_position_(0),
      doc_type_version_(kDefaultDocTypeVersion),
      doc_type_version_written_(0),
      duration_(0.0),
      writer_cluster_(NULL),
      writer_cues_(NULL),
      writer_header_(NULL) {
  const time_t curr_time = time(NULL);
  seed_ = static_cast<unsigned int>(curr_time);
#ifdef _WIN32
  srand(seed_);
#endif
}